

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool show_version(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  return false;
}

Assistant:

bool show_version(CHAR_DATA *ch, char *argument)
{
	send_to_char(SHOW_VERSION, ch);
	send_to_char("\n\r", ch);
	send_to_char(SHOW_AUTHOR, ch);
	send_to_char("\n\r", ch);
	send_to_char(SHOW_DATE, ch);
	send_to_char("\n\r", ch);
	send_to_char(SHOW_CREDITS, ch);
	send_to_char("\n\r", ch);

	return false;
}